

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.hpp
# Opt level: O2

void __thiscall Args::Arg::~Arg(Arg *this)

{
  ~Arg(this);
  operator_delete(this,0xc0);
  return;
}

Assistant:

inline
Arg::~Arg()
{
}